

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::CopyPropagateArrays::GetMemberTypeId
          (CopyPropagateArrays *this,uint32_t id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *access_chain)

{
  uint uVar1;
  Op OVar2;
  pointer puVar3;
  DefUseManager *this_00;
  Instruction *this_01;
  uint32_t index;
  pointer puVar4;
  
  puVar4 = (access_chain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (access_chain->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (puVar4 == puVar3) {
      return id;
    }
    uVar1 = *puVar4;
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    this_01 = analysis::DefUseManager::GetDef(this_00,id);
    OVar2 = this_01->opcode_;
    if ((OVar2 < OpTypeOpaque) &&
       ((index = 0, (0x31800000U >> (OVar2 & OpTypeOpaque) & 1) != 0 ||
        (index = uVar1, OVar2 == OpTypeStruct)))) {
      id = Instruction::GetSingleWordInOperand(this_01,index);
    }
    puVar4 = puVar4 + 1;
  } while (id != 0);
  __assert_fail("id != 0 && \"Tried to extract from an object where it cannot be done.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                ,0x353,
                "uint32_t spvtools::opt::CopyPropagateArrays::GetMemberTypeId(uint32_t, const std::vector<uint32_t> &) const"
               );
}

Assistant:

uint32_t CopyPropagateArrays::GetMemberTypeId(
    uint32_t id, const std::vector<uint32_t>& access_chain) const {
  for (uint32_t element_index : access_chain) {
    Instruction* type_inst = get_def_use_mgr()->GetDef(id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeVector:
        id = type_inst->GetSingleWordInOperand(0);
        break;
      case spv::Op::OpTypeStruct:
        id = type_inst->GetSingleWordInOperand(element_index);
        break;
      default:
        break;
    }
    assert(id != 0 &&
           "Tried to extract from an object where it cannot be done.");
  }
  return id;
}